

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O2

ggml_tensor * ggml_get_first_tensor(ggml_context *ctx)

{
  ggml_object *pgVar1;
  ggml_object **ppgVar2;
  
  ppgVar2 = &ctx->objects_begin;
  while( true ) {
    pgVar1 = *ppgVar2;
    if (pgVar1 == (ggml_object *)0x0) {
      return (ggml_tensor *)0x0;
    }
    if (pgVar1->type == GGML_OBJECT_TYPE_TENSOR) break;
    ppgVar2 = &pgVar1->next;
  }
  return (ggml_tensor *)((long)ctx->mem_buffer + pgVar1->offs);
}

Assistant:

struct ggml_tensor * ggml_get_first_tensor(const struct ggml_context * ctx) {
    struct ggml_object * obj = ctx->objects_begin;

    char * const mem_buffer = ctx->mem_buffer;

    while (obj != NULL) {
        if (obj->type == GGML_OBJECT_TYPE_TENSOR) {
            return (struct ggml_tensor *)(mem_buffer + obj->offs);
        }

        obj = obj->next;
    }

    return NULL;
}